

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
fetch(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
     node_t *parent,
     vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
     *siblings)

{
  pointer *ppnVar1;
  node_t *pnVar2;
  iterator __position;
  pointer pnVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  char *__s;
  uint uVar11;
  node_t tmp_node;
  node_t local_50;
  
  if (this->error_ < 0) {
    return 0;
  }
  uVar8 = parent->left;
  uVar10 = parent->right;
  if (uVar8 < uVar10) {
    uVar9 = 0;
    do {
      if (this->length_ == (size_t *)0x0) {
        __s = this->key_[uVar8];
        sVar4 = strlen(__s);
        uVar7 = parent->depth;
        if (uVar7 <= sVar4) {
          uVar5 = strlen(__s);
          goto LAB_001623be;
        }
      }
      else {
        uVar5 = this->length_[uVar8];
        uVar7 = parent->depth;
        if (uVar7 <= uVar5) {
          __s = this->key_[uVar8];
LAB_001623be:
          uVar11 = 0;
          if (uVar5 != uVar7) {
            uVar11 = (byte)__s[uVar7] + 1;
          }
          if (uVar11 < uVar9) {
            this->error_ = -3;
            return 0;
          }
          pnVar2 = (siblings->
                   super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          __position._M_current =
               (siblings->
               super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (pnVar2 == __position._M_current || uVar9 != uVar11) {
            local_50.depth = uVar7 + 1;
            if (pnVar2 != __position._M_current) {
              __position._M_current[-1].right = uVar8;
            }
            local_50.code = uVar11;
            local_50.left = uVar8;
            if (__position._M_current ==
                (siblings->
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t,std::allocator<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t>>
              ::
              _M_realloc_insert<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t_const&>
                        ((vector<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t,std::allocator<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t>>
                          *)siblings,__position,&local_50);
            }
            else {
              (__position._M_current)->left = uVar8;
              (__position._M_current)->right = local_50.right;
              *(ulong *)__position._M_current = CONCAT44(local_50._4_4_,uVar11);
              (__position._M_current)->depth = local_50.depth;
              ppnVar1 = &(siblings->
                         super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppnVar1 = *ppnVar1 + 1;
            }
            uVar10 = parent->right;
            uVar9 = uVar11;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar10);
  }
  pnVar3 = (siblings->
           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(siblings->
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3;
  if (lVar6 != 0) {
    *(ulong *)((long)pnVar3 + lVar6 + -8) = uVar10;
  }
  return lVar6 >> 5;
}

Assistant:

size_t fetch(const node_t &parent, std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    array_u_type_ prev = 0;

    for (size_t i = parent.left; i < parent.right; ++i) {
      if ((length_ ? length_[i] : length_func_()(key_[i])) < parent.depth)
        continue;

      const node_u_type_ *tmp = reinterpret_cast<node_u_type_ *>(key_[i]);

      array_u_type_ cur = 0;
      if ((length_ ? length_[i] : length_func_()(key_[i])) != parent.depth)
        cur = (array_u_type_)tmp[parent.depth] + 1;

      if (prev > cur) {
        error_ = -3;
        return 0;
      }

      if (cur != prev || siblings.empty()) {
        node_t tmp_node;
        tmp_node.depth = parent.depth + 1;
        tmp_node.code  = cur;
        tmp_node.left  = i;
        if (!siblings.empty()) siblings[siblings.size()-1].right = i;

        siblings.push_back(tmp_node);
      }

      prev = cur;
    }

    if (!siblings.empty())
      siblings[siblings.size()-1].right = parent.right;

    return siblings.size();
  }